

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall CaDiCaL::Solver::set(Solver *this,char *arg,int val)

{
  State SVar1;
  FILE *pFVar2;
  Internal *pIVar3;
  External *this_00;
  undefined1 extraout_AL;
  undefined1 extraout_AL_00;
  undefined1 uVar4;
  int iVar5;
  File *file;
  undefined8 extraout_RAX;
  undefined8 in_RCX;
  char *pcVar6;
  Solver *pSVar7;
  size_t __n;
  Solver *this_01;
  bool bVar8;
  
  this_01 = (Solver *)(ulong)(uint)val;
  bVar8 = this->internal == (Internal *)0x0;
  pFVar2 = (FILE *)this->trace_api_file;
  pcVar6 = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),pFVar2 == (FILE *)0x0 || bVar8);
  if (pFVar2 != (FILE *)0x0 && !bVar8) {
    pcVar6 = arg;
    fprintf(pFVar2,"%s %s %d\n","set",arg,this_01);
    fflush((FILE *)this->trace_api_file);
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this,"bool CaDiCaL::Solver::set(const char *, int)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar6);
  if (this->external == (External *)0x0) {
    set();
LAB_0085d40a:
    set();
LAB_0085d40f:
    set();
  }
  else {
    pIVar3 = this->internal;
    if (pIVar3 == (Internal *)0x0) goto LAB_0085d40a;
    SVar1 = this->_state;
    if ((SVar1 & VALID) == 0) goto LAB_0085d40f;
    iVar5 = strcmp(arg,"log");
    if (iVar5 == 0) {
LAB_0085d3e9:
      bVar8 = Options::set(&pIVar3->opts,arg,val);
      return bVar8;
    }
    iVar5 = strcmp(arg,"quiet");
    if (iVar5 == 0) goto LAB_0085d3e9;
    iVar5 = strcmp(arg,"report");
    if (iVar5 == 0) goto LAB_0085d3e9;
    iVar5 = strcmp(arg,"verbose");
    if ((SVar1 == CONFIGURING) || (iVar5 == 0)) goto LAB_0085d3e9;
  }
  set();
  pFVar2 = *(FILE **)((CaDiCaL *)arg + 0x20);
  pSVar7 = (Solver *)
           CONCAT71((int7)((ulong)pcVar6 >> 8),
                    pFVar2 == (FILE *)0x0 || *(long *)((CaDiCaL *)arg + 8) == 0);
  if (pFVar2 != (FILE *)0x0 && *(long *)((CaDiCaL *)arg + 8) != 0) {
    pSVar7 = this_01;
    fprintf(pFVar2,"%s %s\n","trace_proof");
    fflush(*(FILE **)((CaDiCaL *)arg + 0x20));
  }
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)arg,"bool CaDiCaL::Solver::trace_proof(const char *)",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,&pSVar7->adding_clause);
  if (*(long *)((CaDiCaL *)arg + 0x10) == 0) {
    trace_proof();
LAB_0085d4b8:
    trace_proof();
LAB_0085d4bd:
    trace_proof();
  }
  else {
    if (*(long *)((CaDiCaL *)arg + 8) == 0) goto LAB_0085d4b8;
    if ((*(uint *)((CaDiCaL *)arg + 4) & 0x6e) == 0) goto LAB_0085d4bd;
    if (*(uint *)((CaDiCaL *)arg + 4) == 2) {
      file = (File *)File::write((int)*(long *)((CaDiCaL *)arg + 8),this_01,__n);
      Internal::trace(*(Internal **)((CaDiCaL *)arg + 8),file);
      return file != (File *)0x0;
    }
  }
  trace_proof(this_01);
  bVar8 = this_01->internal == (Internal *)0x0;
  pFVar2 = (FILE *)this_01->trace_api_file;
  pcVar6 = (char *)CONCAT71((int7)((ulong)pSVar7 >> 8),pFVar2 == (FILE *)0x0 || bVar8);
  if (pFVar2 != (FILE *)0x0 && !bVar8) {
    fprintf(pFVar2,"%s\n","reset");
    fflush((FILE *)this_01->trace_api_file);
  }
  pSVar7 = this_01;
  require_solver_pointer_to_be_non_zero
            ((CaDiCaL *)this_01,"CaDiCaL::Solver::~Solver()",
             "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             ,pcVar6);
  if (this_01->external == (External *)0x0) {
    fatal_message_start();
    ~Solver(pSVar7);
  }
  else {
    pIVar3 = this_01->internal;
    if (pIVar3 != (Internal *)0x0) {
      if ((this_01->_state & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) != 0) {
        if (this_01->_state != DELETING) {
          this_01->_state = DELETING;
        }
        tracing_nb_lidrup_env_var_method = 0;
        Internal::~Internal(pIVar3);
        operator_delete(pIVar3,0x1c78);
        this_00 = this_01->external;
        uVar4 = extraout_AL;
        if (this_00 != (External *)0x0) {
          External::~External(this_00);
          operator_delete(this_00,0x238);
          uVar4 = extraout_AL_00;
        }
        if (this_01->close_trace_api_file == true) {
          this_01->close_trace_api_file = false;
          iVar5 = fclose((FILE *)this_01->trace_api_file);
          uVar4 = (undefined1)iVar5;
          tracing_api_calls_through_environment_variable_method = 0;
        }
        return (bool)uVar4;
      }
      goto LAB_0085d5af;
    }
  }
  fatal_message_start();
  ~Solver(pSVar7);
LAB_0085d5af:
  fatal_message_start();
  ~Solver(pSVar7);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

bool Solver::set (const char *arg, int val) {
  TRACE ("set", arg, val);
  REQUIRE_VALID_STATE ();
  if (strcmp (arg, "log") && strcmp (arg, "quiet") &&
      strcmp (arg, "report") && strcmp (arg, "verbose")) {
    REQUIRE (
        state () == CONFIGURING,
        "can only set option 'set (\"%s\", %d)' right after initialization",
        arg, val);
  }
  bool res = internal->opts.set (arg, val);
  LOG_API_CALL_END ("set", arg, val, res);

  return res;
}